

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfNamedBufferStorage(ErrorsTest *this)

{
  ostringstream *poVar1;
  ErrorsTest *this_00;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  int iVar10;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  _Elt_pointer puVar12;
  GLuint *pGVar13;
  undefined4 uVar14;
  ulong uVar15;
  uint uVar16;
  GLuint not_a_buffer_name;
  GLuint GVar17;
  uint uVar18;
  GLuint buffer;
  GLubyte dummy_data [4];
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> too_much_buffers;
  GLuint tmp_buffer;
  GLuint local_230 [2];
  ErrorsTest *local_228;
  undefined4 local_21c;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_218;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar11;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var_00,iVar8);
  GVar17 = 0;
  local_230[0] = 0;
  local_230[1] = 0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = (GLuint *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = (GLuint *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = (GLuint *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_cur = (GLuint *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_218,0);
  do {
    GVar17 = GVar17 + 1;
    cVar2 = (**(code **)(lVar11 + 0xc68))(GVar17);
  } while (cVar2 != '\0');
  (*this->m_pNamedBufferStorage)(GVar17,4,local_230 + 1,2);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x502,
                           " if buffer is not the name of an existing buffer object.");
  (**(code **)(lVar11 + 0x3b8))(1,local_230);
  dVar9 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar9,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x123e);
  (*this->m_pNamedBufferStorage)(local_230[0],-1,local_230 + 1,0x88ea);
  bVar4 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501," if size is negative.");
  (*this->m_pNamedBufferStorage)(local_230[0],0,local_230 + 1,0x88ea);
  bVar5 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501," if size zero.");
  (**(code **)(lVar11 + 0x438))(1,local_230);
  local_230[0] = 0;
  dVar9 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar9,"glDeleteBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x124f);
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_buffer");
  bVar7 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_NV_gpu_multicast");
  uVar16 = (uint)bVar6 << 10 | 0x3c3;
  local_228 = this;
  if ((bVar7) ||
     (bVar7 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_NVX_linked_gpu_multicast"), bVar7)) {
    uVar16 = (uint)bVar6 << 10 | 0xbc3;
  }
  bVar5 = (bVar3 && bVar4) && bVar5;
  uVar18 = 0;
  do {
    if ((uVar16 >> (uVar18 & 0x1f) & 1) == 0) {
      (**(code **)(lVar11 + 0x3b8))(1,local_230);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glCreateBuffers failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x1270);
      (*local_228->m_pNamedBufferStorage)(local_230[0],4,local_230 + 1,1 << ((byte)uVar18 & 0x1f));
      bVar3 = ErrorCheckAndLog(local_228,"glNamedBufferStorage",0x501,
                               " if flags has any bits set other than DYNAMIC_STORAGE_BIT, MAP_READ_BIT, MAP_WRITE_BIT, MAP_PERSISTENT_BIT, MAP_COHERENT_BIT or CLIENT_STORAGE_BIT."
                              );
      (**(code **)(lVar11 + 0x438))(1,local_230);
      local_230[0] = 0;
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glDeleteBuffers failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x127f);
      bVar5 = (bool)(bVar5 & bVar3);
    }
    uVar18 = uVar18 + 1;
  } while (uVar18 != 0x20);
  (**(code **)(lVar11 + 0x3b8))(1,local_230);
  this_00 = local_228;
  dVar9 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar9,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1288);
  (*this_00->m_pNamedBufferStorage)(local_230[0],4,local_230 + 1,0x40);
  bVar3 = ErrorCheckAndLog(this_00,"glNamedBufferStorage",0x501,
                           " if flags contains MAP_PERSISTENT_BIT but does not contain at least one of MAP_READ_BIT or MAP_WRITE_BIT."
                          );
  uVar15 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  (**(code **)(lVar11 + 0x438))(1,local_230);
  local_230[0] = 0;
  dVar9 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar9,"glDeleteBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1296);
  (**(code **)(lVar11 + 0x3b8))(1,local_230);
  dVar9 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar9,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x129d);
  (*this_00->m_pNamedBufferStorage)(local_230[0],4,local_230 + 1,0x83);
  bVar3 = ErrorCheckAndLog(this_00,"glNamedBufferStorage",0x501,
                           " if flags contains MAP_COHERENT_BIT, but does not also contain MAP_PERSISTENT_BIT."
                          );
  (**(code **)(lVar11 + 0x438))(1,local_230);
  local_230[0] = 0;
  dVar9 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar9,"glDeleteBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x12ac);
  local_21c = (undefined4)CONCAT71((int7)(uVar15 >> 8),(byte)uVar15 & bVar5 & bVar3);
  iVar8 = 0x100;
  while( true ) {
    local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
    (**(code **)(lVar11 + 0x3b8))(1,local_1b0);
    dVar9 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar9,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x12c5);
    if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_int,std::allocator<unsigned_int>>::_M_push_back_aux<unsigned_int_const&>
                ((deque<unsigned_int,std::allocator<unsigned_int>> *)&local_218,(uint *)local_1b0);
    }
    else {
      *local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1b0._0_4_;
      local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    (*local_228->m_pNamedBufferStorage)(local_1b0._0_4_,0x7fffffffffffffff,(GLvoid *)0x0,3);
    iVar10 = (**(code **)(lVar11 + 0x800))();
    if (iVar10 != 0) break;
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      local_1b0._0_8_ = ((local_228->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Test of NamedBufferStorage out of memory negative behavior failed to generate erroneous situation. Direct State Access Buffers Test\'s MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or the driver implementation does not inform about out of memory problem."
                 ,0x110);
      uVar14 = local_21c;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
LAB_00a8d63c:
      if (local_230[0] != 0) {
        (**(code **)(lVar11 + 0x438))(1,local_230);
        local_230[0] = 0;
      }
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_218._M_impl.super__Deque_impl_data._M_start._M_cur) {
        pGVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          puVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == pGVar13) {
            puVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
          }
          local_1b0._0_4_ = puVar12[-1];
          if (puVar12[-1] != 0) {
            (**(code **)(lVar11 + 0x438))(1,local_1b0);
            pGVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
          }
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == pGVar13) {
            operator_delete(pGVar13,0x200);
            pGVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = pGVar13 + 0x80;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = pGVar13 + 0x7f;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = pGVar13;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_218._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_218);
      return SUB41(uVar14,0);
    }
  }
  uVar14 = local_21c;
  if (iVar10 != 0x505) {
    local_1b0._0_8_ = ((local_228->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "NamedBufferStorage does not generate OUT_OF_MEMORY error if the GL is unable to create a data store with the specified size."
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"The error value of ",0x13)
    ;
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar10;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," was observed.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    uVar14 = 0;
  }
  goto LAB_00a8d63c;
}

Assistant:

bool ErrorsTest::TestErrorsOfNamedBufferStorage()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint				buffer		  = 0;
	glw::GLubyte			dummy_data[4] = {};
	std::stack<glw::GLuint> too_much_buffers;

	try
	{
		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pNamedBufferStorage(not_a_buffer_name, sizeof(dummy_data), dummy_data, GL_MAP_WRITE_BIT);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test negative or zero size error behavior. */
		{
			/* Object creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Test negative size. */
			m_pNamedBufferStorage(buffer, -1, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE, " if size is negative.");

			/* Test zero size. */
			m_pNamedBufferStorage(buffer, 0, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE, " if size zero.");

			/* Clean-up. */
			gl.deleteBuffers(1, &buffer);

			buffer = 0;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
		}

		/* Test invalid usage bit error behavior. */
		{
			/* Prepare for invalid type error behavior verification. */
			glw::GLuint valid_bits = GL_DYNAMIC_STORAGE_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT |
									 GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT | GL_CLIENT_STORAGE_BIT;

			if (m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_buffer"))
			{
				valid_bits |= GL_SPARSE_STORAGE_BIT_ARB;
			}

			if (m_context.getContextInfo().isExtensionSupported("GL_NV_gpu_multicast") ||
				m_context.getContextInfo().isExtensionSupported("GL_NVX_linked_gpu_multicast"))
			{
				valid_bits |= GL_PER_GPU_STORAGE_BIT_NV;
			}

			glw::GLuint invalid_bits = ~valid_bits;

			glw::GLuint bits_count = CHAR_BIT * sizeof(invalid_bits);

			/* Test. */
			for (glw::GLuint i = 0; i < bits_count; ++i)
			{
				glw::GLuint possibly_invalid_bit = (1 << i);

				if (invalid_bits & possibly_invalid_bit)
				{
					/* Object creation. */
					gl.createBuffers(1, &buffer);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

					/* Test invalid bit. */
					m_pNamedBufferStorage(buffer, sizeof(dummy_data), dummy_data, possibly_invalid_bit);

					is_ok &=
						ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE,
										 " if flags has any bits set other than DYNAMIC_STORAGE_BIT, MAP_READ_BIT,"
										 " MAP_WRITE_BIT, MAP_PERSISTENT_BIT, MAP_COHERENT_BIT or CLIENT_STORAGE_BIT.");

					/* Release object. */
					gl.deleteBuffers(1, &buffer);

					buffer = 0;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
				}
			}
		}

		/* Test improper persistent bit behavior error behavior. */
		{
			/* Object creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Test. */
			m_pNamedBufferStorage(buffer, sizeof(dummy_data), dummy_data, GL_MAP_PERSISTENT_BIT);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE, " if flags contains MAP_PERSISTENT_BIT "
																				"but does not contain at least one of "
																				"MAP_READ_BIT or MAP_WRITE_BIT.");

			/* Clean-up. */
			gl.deleteBuffers(1, &buffer);

			buffer = 0;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
		}

		/* Test improper persistent bit behavior error behavior. */
		{
			/* Object creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Test. */
			m_pNamedBufferStorage(buffer, sizeof(dummy_data), dummy_data,
								  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_COHERENT_BIT);

			is_ok &=
				ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE,
								 " if flags contains MAP_COHERENT_BIT, but does not also contain MAP_PERSISTENT_BIT.");

			/* Clean-up. */
			gl.deleteBuffers(1, &buffer);

			buffer = 0;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
		}

		/* Test out of memory error behavior. */
		{
			/* Calculate maximum buffer size (depending on number of bits of function argument). */
			glw::GLsizei max_pointer_unsigned_bits =
				(CHAR_BIT * sizeof(glw::GLsizeiptr) - 1) /* do not include possible sign bit */;
			glw::GLsizeiptr max_possible_size = 0;

			for (glw::GLsizei i = 0; i < max_pointer_unsigned_bits; ++i)
			{
				max_possible_size |= ((glw::GLsizeiptr)1 << i);
			}

			/* Error storing variable. */
			glw::GLenum error = GL_NO_ERROR;

			/* Try to overflow by allocating biggest possible buffers in a loop. */
			for (glw::GLuint i = 0; i < MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR; ++i)
			{
				/* New big buffer creation. */
				glw::GLuint tmp_buffer = 0;

				gl.createBuffers(1, &tmp_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

				/* Add it to delete list. */
				too_much_buffers.push(tmp_buffer);

				/* Try to allocate big buffer storage. */
				m_pNamedBufferStorage(tmp_buffer, max_possible_size, DE_NULL, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT);

				/* Check for errors. */
				error = gl.getError();

				if (error != GL_NO_ERROR)
				{
					break;
				}
			}

			if (error == GL_NO_ERROR)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Test of NamedBufferStorage out of memory negative behavior failed to "
												"generate erroneous situation. "
												"Direct State Access Buffers Test's "
												"MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or "
												"the driver implementation does not inform about out of memory problem."
					<< tcu::TestLog::EndMessage;
			}
			else
			{
				if (error != GL_OUT_OF_MEMORY)
				{
					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "NamedBufferStorage does not generate OUT_OF_MEMORY error if the "
													"GL is unable to create a data store with the specified size."
						<< "The error value of " << glu::getErrorStr(error) << " was observed."
						<< tcu::TestLog::EndMessage;

					is_ok = false;
				}
			}
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	while (!too_much_buffers.empty())
	{
		glw::GLuint tmp_buffer = too_much_buffers.top();

		if (tmp_buffer)
		{
			gl.deleteBuffers(1, &tmp_buffer);
		}

		too_much_buffers.pop();
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}